

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O3

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  int *piVar11;
  char **ppcVar12;
  option *poVar13;
  uint *prev_given;
  uint *field_given;
  char *pcVar14;
  custom_getopt_data *d;
  char **possible_values;
  char *pcVar15;
  uint uVar16;
  size_t sVar17;
  char cVar18;
  option *poVar19;
  option *poVar20;
  option *poVar21;
  int iVar22;
  ulong uVar23;
  char *pcVar24;
  cmdline_parser_arg_type arg_type;
  int no_free;
  char short_opt;
  char *in_stack_fffffffffffffe28;
  option *local_1b8;
  gengetopt_args_info local_e8;
  
  package_name = *argv;
  iVar7 = params->override;
  iVar1 = params->check_ambiguity;
  d = (custom_getopt_data *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  local_e8.method_given = 0;
  local_e8.npoints_given = 0;
  local_e8.delta_given = 0;
  local_e8.help_given = 0;
  local_e8.version_given = 0;
  local_e8.input_given = 0;
  local_e8.box_given = 0;
  local_e8.box_flag = 0;
  local_e8.input_arg = (char *)0x0;
  local_e8.input_orig = (char *)0x0;
  local_e8.method_arg = (char *)0x0;
  local_e8.method_orig = (char *)0x0;
  local_e8.npoints_arg = 0x19;
  local_e8.npoints_orig = (char *)0x0;
  local_e8.delta_orig = (char *)0x0;
  local_e8.help_help = gengetopt_args_info_help[0];
  local_e8.version_help = gengetopt_args_info_help[1];
  local_e8.input_help = gengetopt_args_info_help[2];
  local_e8.box_help = gengetopt_args_info_help[3];
  local_e8.method_help = gengetopt_args_info_help[4];
  local_e8.npoints_help = gengetopt_args_info_help[5];
  local_e8.delta_help = gengetopt_args_info_help[6];
  local_e8.inputs = (char **)0x0;
  local_e8.inputs_num = 0;
  custom_opterr = params->print_errors;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 0;
  iVar22 = 0;
  if (argc < 1) {
LAB_0012ffae:
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    cmdline_parser_release(&local_e8);
    iVar7 = 0;
    uVar16 = argc - iVar22;
    if (uVar16 != 0 && iVar22 <= argc) {
      args_info->inputs_num = uVar16;
      ppcVar12 = (char **)malloc((ulong)uVar16 * 8);
      args_info->inputs = ppcVar12;
      iVar7 = 0;
      uVar23 = 0;
      do {
        pcVar15 = gengetopt_strdup(argv[(long)iVar22 + uVar23]);
        args_info->inputs[uVar23] = pcVar15;
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
    }
  }
  else {
    iVar5 = custom_opterr;
    pcVar15 = custom_optarg;
    iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012f93f:
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22;
    custom_optarg = pcVar15;
    custom_opterr = iVar5;
    iVar5 = custom_opterr;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
       ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012f9b1:
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
      }
      else {
        exchange(argv,d);
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < argc) {
        ppcVar12 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        while ((**ppcVar12 != '-' || ((*ppcVar12)[1] == '\0'))) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          ppcVar12 = ppcVar12 + 1;
          if (argc == _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            piVar11 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
            goto LAB_0012ff81;
          }
        }
      }
      iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
LAB_0012ff87:
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != argc) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        }
        goto LAB_0012ffae;
      }
      lVar8 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      pcVar15 = argv[lVar8];
      if (*pcVar15 != '-') {
LAB_00130217:
        uVar16 = 1;
        custom_optarg = pcVar15;
        iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar15;
        goto switchD_0012fde8_caseD_63;
      }
      cVar18 = pcVar15[1];
      if (cVar18 == '-') {
        if (pcVar15[2] == '\0') {
          iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          iVar1 = iVar7;
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
            exchange(argv,d);
            iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            iVar1 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar1;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
          piVar11 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
LAB_0012ff81:
          *piVar11 = argc;
          iVar22 = argc;
          goto LAB_0012ff87;
        }
      }
      else if (cVar18 == '\0') goto LAB_00130217;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar15 + (ulong)(cVar18 == '-') + 1;
    }
    else {
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
         (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_0012f9b1;
      lVar8 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    pcVar15 = argv[lVar8];
    if (pcVar15[1] != '-') {
      pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
      cVar18 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      uVar16 = (uint)cVar18;
      short_opt = -6;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar15;
      pvVar9 = memchr("hVi:bm:n:d:",uVar16,0xc);
      if (pcVar24[1] == '\0') {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
        iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if ((pvVar9 == (void *)0x0) || (cVar18 == ':')) {
        if (iVar5 != 0) {
          fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar16);
        }
        goto LAB_0013003b;
      }
      if (*(char *)((long)pvVar9 + 1) == ':') {
        if (*(char *)((long)pvVar9 + 2) == ':') {
          if (*pcVar15 == '\0') {
            pcVar15 = (char *)0x0;
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar15;
        }
        else {
          if (*pcVar15 == '\0') {
            if (iVar22 != argc) {
              pcVar15 = argv[iVar22];
              goto LAB_0012fd9a;
            }
            cVar18 = '?';
            if (iVar5 != 0) {
              short_opt = 'r';
              fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar16);
              cVar18 = '?';
              iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            }
          }
          else {
LAB_0012fd9a:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar15;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
            iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          uVar16 = (uint)cVar18;
        }
      }
LAB_0012fdae:
      iVar5 = custom_opterr;
      pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if ((int)uVar16 < 0x56) {
        if (uVar16 == 0xffffffff) goto LAB_0012ffae;
        if ((uVar16 != 0) && (uVar16 != 0x3f)) {
switchD_0012fde8_caseD_63:
          do {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar6;
            cmdline_parser_internal();
switchD_0012fde8_default:
            iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          } while (uVar16 != 0x56);
          cmdline_parser_print_version();
LAB_0013024f:
          cmdline_parser_free(&local_e8);
          exit(0);
        }
        goto LAB_00130049;
      }
      switch(uVar16) {
      case 0x62:
        d = (custom_getopt_data *)0x0;
        possible_values = (char **)0x0;
        pcVar14 = (char *)0x62;
        iVar6 = 0x297f8b;
        no_free = 1;
        arg_type = ARG_FLAG;
        prev_given = &local_e8.box_given;
        field_given = &args_info->box_given;
        ppcVar12 = (char **)&args_info->box_flag;
        break;
      case 99:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x6a:
      case 0x6b:
      case 0x6c:
        goto switchD_0012fde8_caseD_63;
      case 100:
        possible_values = (char **)0x0;
        pcVar14 = (char *)0x64;
        iVar6 = 0x2961ca;
        no_free = 0;
        arg_type = ARG_DOUBLE;
        prev_given = &local_e8.delta_given;
        field_given = &args_info->delta_given;
        d = (custom_getopt_data *)&args_info->delta_orig;
        ppcVar12 = (char **)&args_info->delta_arg;
        break;
      case 0x68:
        cmdline_parser_print_help();
        goto LAB_0013024f;
      case 0x69:
        possible_values = (char **)0x0;
        pcVar14 = (char *)0x69;
        iVar6 = 0x2961b5;
        prev_given = &local_e8.input_given;
        field_given = &args_info->input_given;
        d = (custom_getopt_data *)&args_info->input_orig;
        ppcVar12 = &args_info->input_arg;
        goto LAB_0012ff0c;
      case 0x6d:
        possible_values = cmdline_parser_method_values;
        pcVar14 = (char *)0x6d;
        iVar6 = 0x2961bb;
        prev_given = &local_e8.method_given;
        field_given = &args_info->method_given;
        d = (custom_getopt_data *)&args_info->method_orig;
        ppcVar12 = &args_info->method_arg;
LAB_0012ff0c:
        no_free = 0;
        arg_type = ARG_STRING;
        break;
      case 0x6e:
        possible_values = (char **)0x0;
        pcVar14 = (char *)0x6e;
        iVar6 = 0x2961c2;
        no_free = 0;
        arg_type = ARG_INT;
        pcVar24 = "25";
        prev_given = &local_e8.npoints_given;
        field_given = &args_info->npoints_given;
        d = (custom_getopt_data *)&args_info->npoints_orig;
        ppcVar12 = (char **)&args_info->npoints_arg;
        goto LAB_0012ff18;
      default:
        goto switchD_0012fde8_default;
      }
      pcVar24 = (char *)0x0;
LAB_0012ff18:
      iVar6 = update_arg(ppcVar12,(char **)d,field_given,prev_given,
                         _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,possible_values,
                         pcVar24,arg_type,iVar1,iVar7,no_free,iVar6,pcVar14,short_opt,
                         in_stack_fffffffffffffe28);
      if (iVar6 != 0) goto LAB_00130049;
      goto LAB_0012f93f;
    }
    for (sVar17 = 0;
        (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar17] != '\0' &&
        (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar17] != '=')); sVar17 = sVar17 + 1)
    {
    }
    bVar2 = false;
    pcVar14 = "help";
    local_1b8 = (option *)0x0;
    poVar19 = cmdline_parser_internal::long_options;
    poVar20 = poVar19;
    bVar3 = bVar2;
    do {
      while (iVar6 = strncmp(pcVar14,pcVar24,sVar17), poVar13 = local_1b8, poVar21 = poVar19,
            iVar6 == 0) {
        poVar19 = poVar19 + 1;
        bVar4 = bVar2;
        do {
          sVar10 = strlen(pcVar14);
          if ((int)sVar10 == (int)sVar17) {
            poVar13 = poVar19 + -1;
            goto LAB_0012fc65;
          }
          poVar13 = poVar20;
          poVar21 = poVar20;
          bVar2 = bVar3;
          if (local_1b8 == (option *)0x0) goto LAB_0012fc27;
          if (((local_1b8->has_arg == poVar19[-1].has_arg) && (local_1b8->flag == poVar19[-1].flag))
             && (local_1b8->val == poVar19[-1].val)) {
            poVar13 = local_1b8;
            poVar21 = poVar19 + -1;
            bVar2 = bVar4;
            goto LAB_0012fc27;
          }
          pcVar14 = poVar19->name;
          if (pcVar14 == (char *)0x0) goto LAB_00130015;
          iVar6 = strncmp(pcVar14,pcVar24,sVar17);
          poVar19 = poVar19 + 1;
          bVar2 = true;
          bVar4 = bVar2;
        } while (iVar6 == 0);
        pcVar14 = poVar19->name;
        if (pcVar14 == (char *)0x0) goto LAB_00130015;
      }
LAB_0012fc27:
      pcVar14 = poVar21[1].name;
      poVar19 = poVar21 + 1;
      local_1b8 = poVar13;
      poVar20 = poVar19;
      bVar3 = bVar2;
    } while (pcVar14 != (char *)0x0);
    if (bVar2) {
LAB_00130015:
      if (iVar5 != 0) {
        fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar15);
        pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
        iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      sVar17 = strlen(pcVar24);
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar24 + sVar17;
    }
    else {
      if (poVar13 != (option *)0x0) {
LAB_0012fc65:
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
        if (pcVar24[sVar17] == '\0') {
          if (poVar13->has_arg == 1) {
            if (argc <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              if (iVar5 != 0) {
                fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar15);
                pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
              goto LAB_0013015a;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                 argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 2;
          }
        }
        else {
          if (poVar13->has_arg == 0) {
            pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            if (iVar5 != 0) {
              if (pcVar15[1] == '-') {
                fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                        poVar13->name);
                pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
              else {
                fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                        (ulong)(uint)(int)*pcVar15,poVar13->name);
                pcVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
            }
LAB_0013015a:
            sVar17 = strlen(pcVar24);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar24 + sVar17;
            goto LAB_0013003b;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar24 + sVar17 + 1;
        }
        iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        short_opt = -0x10;
        sVar17 = strlen(pcVar24);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar24 + sVar17;
        uVar16 = poVar13->val;
        if ((uint *)poVar13->flag == (uint *)0x0) goto LAB_0012fdae;
        *poVar13->flag = uVar16;
        goto LAB_0013003b;
      }
      if (iVar5 != 0) {
        fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar24);
        iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
    }
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22 + 1;
LAB_0013003b:
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
LAB_00130049:
    cmdline_parser_release(&local_e8);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  FIX_UNUSED(check_required);
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "box",	0, NULL, 'b' },
        { "method",	1, NULL, 'm' },
        { "npoints",	1, NULL, 'n' },
        { "delta",	1, NULL, 'd' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:bm:n:d:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* Input file name.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* Optimize box geometry before performing calculation.  */
        
        
          if (update_arg((void *)&(args_info->box_flag), 0, &(args_info->box_given),
              &(local_args_info.box_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "box", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'm':	/* Calculation Method.  */
        
        
          if (update_arg( (void *)&(args_info->method_arg), 
               &(args_info->method_orig), &(args_info->method_given),
              &(local_args_info.method_given), optarg, cmdline_parser_method_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "method", 'm',
              additional_error))
            goto failure;
        
          break;
        case 'n':	/* number of points for fitting
        stress-strain relationship.  */
        
        
          if (update_arg( (void *)&(args_info->npoints_arg), 
               &(args_info->npoints_orig), &(args_info->npoints_given),
              &(local_args_info.npoints_given), optarg, 0, "25", ARG_INT,
              check_ambiguity, override, 0, 0,
              "npoints", 'n',
              additional_error))
            goto failure;
        
          break;
        case 'd':	/* size of relative volume changes for strains.  */
        
        
          if (update_arg( (void *)&(args_info->delta_arg), 
               &(args_info->delta_orig), &(args_info->delta_given),
              &(local_args_info.delta_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "delta", 'd',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */




  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}